

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserClass.cc
# Opt level: O2

map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
ParserClass::parseAggFunc_abi_cxx11_
          (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,ParserClass *this)

{
  _Rb_tree_header *p_Var1;
  pointer pbVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  pointer pbVar5;
  int index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> aggFunc;
  key_type local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  pbVar5 = (this->inputs).aggre_funcs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->inputs).aggre_funcs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pbVar5 == pbVar2) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string((string *)&local_50,(string *)pbVar5);
    if ((byte)(*local_50._M_dataplus._M_p + 0x9fU) < 0x1a) {
      local_70._M_dataplus._M_p._0_4_ = 0;
      iVar3 = std::
              _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&__return_storage_ptr__->_M_t,(key_type *)&local_70);
      if ((_Rb_tree_header *)iVar3._M_node == p_Var1) {
        local_70._M_dataplus._M_p._0_4_ = 0;
        pmVar4 = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](__return_storage_ptr__,(key_type *)&local_70);
        std::__cxx11::string::_M_assign((string *)pmVar4);
      }
      else {
        std::operator+(&local_70,", ",&local_50);
        local_74 = 0;
        pmVar4 = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](__return_storage_ptr__,&local_74);
        std::__cxx11::string::append((string *)pmVar4);
LAB_00104332:
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
    else {
      local_74 = *local_50._M_dataplus._M_p + -0x30;
      iVar3 = std::
              _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&__return_storage_ptr__->_M_t,&local_74);
      if ((_Rb_tree_header *)iVar3._M_node != p_Var1) {
        std::operator+(&local_70,", ",&local_50);
        pmVar4 = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](__return_storage_ptr__,&local_74);
        std::__cxx11::string::append((string *)pmVar4);
        goto LAB_00104332;
      }
      pmVar4 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](__return_storage_ptr__,&local_74);
      std::__cxx11::string::_M_assign((string *)pmVar4);
    }
    std::__cxx11::string::~string((string *)&local_50);
    pbVar5 = pbVar5 + 1;
  } while( true );
}

Assistant:

std::map<int, std::string> ParserClass::parseAggFunc()
{
    std::map<int, std::string> agg_map;
    for (auto aggFunc : this->inputs.aggre_funcs)
    {
        if ('a' <= aggFunc[0] && aggFunc[0] <= 'z')
        {
            if (agg_map.find(0) == agg_map.end())
            {
                agg_map[0] = aggFunc;
                continue;
            }
            agg_map[0] += ", " + aggFunc;
        }
        else
        {
            int index = aggFunc[0] - '0';
            if (agg_map.find(index) == agg_map.end())
            {
                agg_map[index] = aggFunc;
                continue;
            }
            agg_map[index] += ", " + aggFunc;
        }
    }
    return agg_map;
}